

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMinSop.c
# Opt level: O1

void Min_SopMinimize(Min_Man_t *p)

{
  undefined1 *puVar1;
  Min_Cube_t **ppMVar2;
  char cVar3;
  char cVar4;
  bool bVar5;
  bool bVar6;
  Min_Man_t *p_00;
  uint uVar7;
  int iVar8;
  int iVar9;
  sbyte sVar10;
  sbyte sVar11;
  uint uVar12;
  uint uVar13;
  Min_Cube_t *pMVar14;
  Min_Cube_t *pMVar15;
  Min_Cube_t *pMVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  long lVar22;
  ulong uVar23;
  Min_Cube_t *pMVar24;
  Min_Cube_t *pMVar25;
  uint uVar26;
  uint uVar27;
  int Var0;
  int local_68;
  int local_64;
  uint local_60;
  uint local_5c;
  Min_Man_t *local_58;
  long local_50;
  Min_Cube_t **local_48;
  long local_40;
  int local_38;
  uint local_34;
  
  local_58 = p;
  if (2 < p->nCubes) {
    do {
      local_38 = p->nCubes;
      pMVar15 = p->pBubble;
      ppMVar2 = p->ppStore;
      pMVar15->pNext = *ppMVar2;
      *ppMVar2 = pMVar15;
      puVar1 = &p->pBubble->field_0x8;
      *(uint *)puVar1 = *(uint *)puVar1 & 0x3fffff;
LAB_0044b47c:
      pMVar15 = p->pBubble;
      uVar7 = *(uint *)&pMVar15->field_0x8 >> 0x16;
      uVar23 = (ulong)uVar7;
      pMVar25 = (Min_Cube_t *)((ulong)(uVar7 * 8) + (long)p->ppStore);
      do {
        pMVar14 = pMVar25;
        pMVar25 = pMVar14->pNext;
        if (pMVar25 == (Min_Cube_t *)0x0) break;
      } while (pMVar25 != pMVar15);
      if (pMVar25 != pMVar15) {
        __assert_fail("pCube == p->pBubble",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covMinSop.c"
                      ,0x6c,"void Min_SopRewrite(Min_Man_t *)");
      }
      pMVar14->pNext = pMVar15->pNext;
      pMVar15 = p->pBubble->pNext;
      if (pMVar15 == (Min_Cube_t *)0x0) {
        uVar19 = uVar23;
        if ((int)uVar7 < p->nVars) {
          uVar19 = (ulong)(uint)p->nVars;
        }
        lVar18 = -(ulong)(uVar7 * 8);
        do {
          if (uVar19 == uVar23) {
            pMVar15 = (Min_Cube_t *)0x0;
            uVar7 = (int)uVar19 + 1;
            goto LAB_0044b4ff;
          }
          pMVar15 = p->ppStore[uVar23 + 1];
          uVar23 = uVar23 + 1;
          lVar18 = lVar18 + -8;
        } while (pMVar15 == (Min_Cube_t *)0x0);
        pMVar14 = (Min_Cube_t *)((long)p->ppStore - lVar18);
        uVar7 = (uint)uVar23;
      }
LAB_0044b4ff:
      pMVar25 = pMVar15;
      if (pMVar15 != (Min_Cube_t *)0x0) {
        do {
          pMVar24 = pMVar25;
          pMVar25 = pMVar24->pNext;
          if (pMVar25 == (Min_Cube_t *)0x0) {
            if (p->nVars <= (int)uVar7) goto LAB_0044b569;
            pMVar25 = (Min_Cube_t *)(p->ppStore + (long)(int)uVar7 + 1);
            goto LAB_0044b544;
          }
          iVar8 = Min_CubesDistTwo(pMVar15,pMVar25,&local_68,&local_64);
        } while (iVar8 == 0);
        goto LAB_0044b56c;
      }
    } while (3.0 < ((double)(local_38 - p->nCubes) * 100.0) / (double)local_38);
  }
  return;
  while (iVar8 = Min_CubesDistTwo(pMVar15,pMVar25,&local_68,&local_64), iVar8 == 0) {
LAB_0044b544:
    pMVar24 = pMVar25;
    pMVar25 = pMVar24->pNext;
    if (pMVar25 == (Min_Cube_t *)0x0) goto LAB_0044b569;
  }
LAB_0044b56c:
  p_00 = local_58;
  iVar8 = local_68;
  if (pMVar25 == (Min_Cube_t *)0x0) {
    pMVar25 = p->pBubble;
    pMVar25->pNext = pMVar15->pNext;
    pMVar15->pNext = pMVar25;
    *(uint *)&pMVar25->field_0x8 =
         *(uint *)&pMVar25->field_0x8 & 0x3fffff | *(uint *)&pMVar15->field_0x8 & 0xffc00000;
    goto LAB_0044b47c;
  }
  pMVar24->pNext = pMVar25->pNext;
  pMVar14->pNext = p->pBubble;
  pMVar14 = p->pBubble;
  pMVar14->pNext = pMVar15->pNext;
  *(uint *)&pMVar14->field_0x8 =
       *(uint *)&pMVar14->field_0x8 & 0x3fffff | *(uint *)&pMVar15->field_0x8 & 0xffc00000;
  p->nCubes = p->nCubes + -2;
  pMVar14 = p->pBubble;
  if ((pMVar15 == pMVar14) || (pMVar25 == pMVar14)) {
    __assert_fail("pCube != p->pBubble && pThis != p->pBubble",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covMinSop.c"
                  ,0x9b,"void Min_SopRewrite(Min_Man_t *)");
  }
  lVar18 = (long)(local_68 >> 4);
  uVar7 = pMVar15->uData[lVar18];
  uVar20 = local_68 * 2 & 0x1e;
  sVar10 = (sbyte)uVar20;
  lVar22 = (long)(local_64 >> 4);
  local_60 = local_64 * 2 & 0x1e;
  sVar11 = (sbyte)local_60;
  uVar13 = uVar7 >> sVar10 & 3;
  uVar26 = pMVar25->uData[lVar18] >> sVar10 & 3;
  if (uVar13 == uVar26) {
LAB_0044bcda:
    __assert_fail("v00 != v10 && v01 != v11",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covMinSop.c"
                  ,0xa3,"void Min_SopRewrite(Min_Man_t *)");
  }
  uVar12 = pMVar15->uData[lVar22] >> sVar11 & 3;
  uVar27 = pMVar25->uData[lVar22] >> sVar11 & 3;
  if (uVar12 == uVar27) goto LAB_0044bcda;
  if ((uVar13 == 3) && (uVar12 == 3)) {
    __assert_fail("v00 != 3 || v01 != 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covMinSop.c"
                  ,0xa4,"void Min_SopRewrite(Min_Man_t *)");
  }
  if ((uVar26 == 3) && (uVar27 == 3)) {
    __assert_fail("v10 != 3 || v11 != 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covMinSop.c"
                  ,0xa5,"void Min_SopRewrite(Min_Man_t *)");
  }
  pMVar24 = pMVar25;
  if (((uVar26 == 3) || (uVar13 == 3 || uVar12 == 3)) || (uVar27 == 3)) {
    pMVar16 = pMVar15;
    uVar7 = uVar26;
    uVar20 = uVar27;
    if (((uVar13 != 3 && uVar12 != 3) &&
        (pMVar24 = pMVar15, pMVar16 = pMVar25, uVar7 = uVar13, uVar13 = uVar26, uVar20 = uVar12,
        uVar12 = uVar27, uVar26 != 3)) && (uVar27 != 3)) {
      __assert_fail("v10 == 3 || v11 == 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covMinSop.c"
                    ,0xee,"void Min_SopRewrite(Min_Man_t *)");
    }
    pMVar15 = pMVar16;
    uVar26 = uVar20;
    if (uVar13 != 3) {
      if (uVar12 != 3) {
        __assert_fail("v01 == 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covMinSop.c"
                      ,0xf7,"void Min_SopRewrite(Min_Man_t *)");
      }
      local_68 = local_64;
      local_64 = iVar8;
      uVar26 = uVar7;
      uVar12 = uVar13;
      uVar7 = uVar20;
    }
    cVar3 = (char)local_68;
    iVar8 = local_68 >> 4;
    cVar4 = (char)local_64;
    iVar9 = local_64 >> 4;
    pMVar25 = pMVar24;
    if (uVar26 == 3) {
      if (uVar7 == 3 || uVar12 == 3) {
        __assert_fail("v01 != 3 && v10 != 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covMinSop.c"
                      ,0x100,"void Min_SopRewrite(Min_Man_t *)");
      }
      pMVar15->uData[iVar8] = pMVar15->uData[iVar8] ^ uVar7 << (cVar3 * '\x02' & 0x1fU);
      pMVar15->uData[iVar9] = pMVar15->uData[iVar9] ^ 3 << (cVar4 * '\x02' & 0x1fU);
      uVar13 = *(uint *)&pMVar15->field_0x8 & 0xffc00000;
      *(uint *)&pMVar15->field_0x8 = uVar13 + (*(uint *)&pMVar15->field_0x8 & 0x3fffff) + 0x400000;
      uVar23 = 0;
      do {
        pMVar14 = local_58->ppStore[uVar23];
        if (pMVar14 != (Min_Cube_t *)0x0) {
          do {
            if (pMVar14 != local_58->pBubble) {
              uVar20 = *(uint *)&pMVar14->field_0x8 >> 10 & 0xfff;
              if (uVar20 == 0) {
LAB_0044babd:
                bVar6 = false;
                goto LAB_0044babf;
              }
              uVar19 = 0;
              while ((pMVar15->uData[uVar19] & ~pMVar14->uData[uVar19]) == 0) {
                uVar19 = uVar19 + 1;
                if (uVar20 == uVar19) goto LAB_0044babd;
              }
            }
            pMVar14 = pMVar14->pNext;
          } while (pMVar14 != (Min_Cube_t *)0x0);
        }
        uVar23 = uVar23 + 1;
      } while (uVar23 != (uVar13 + 0x400000 >> 0x16) + 1);
      bVar6 = true;
LAB_0044babf:
      pMVar15->uData[iVar8] = pMVar15->uData[iVar8] ^ uVar7 << (cVar3 * '\x02' & 0x1fU);
      pMVar15->uData[iVar9] = pMVar15->uData[iVar9] ^ 3 << (cVar4 * '\x02' & 0x1fU);
      *(int *)&pMVar15->field_0x8 = *(int *)&pMVar15->field_0x8 + -0x400000;
      if (!bVar6) {
LAB_0044bbbe:
        Extra_MmFixedEntryRecycle(local_58->pMemMan,(char *)pMVar24);
        pMVar15->uData[local_64 >> 4] =
             pMVar15->uData[local_64 >> 4] ^ (uVar12 ^ 3) << ((char)local_64 * '\x02' & 0x1fU);
        *(int *)&pMVar15->field_0x8 = *(int *)&pMVar15->field_0x8 + -0x400000;
        pMVar24 = pMVar15;
        goto LAB_0044bc4d;
      }
      pMVar15->uData[iVar8] = pMVar15->uData[iVar8] ^ uVar7 << (cVar3 * '\x02' & 0x1fU);
      *(int *)&pMVar15->field_0x8 = *(int *)&pMVar15->field_0x8 + 0x400000;
      iVar8 = local_58->nCubes;
      Min_SopAddCube(local_58,pMVar15);
      iVar9 = p_00->nCubes;
      if (iVar9 <= iVar8) goto LAB_0044bc4d;
      uVar13 = *(uint *)&pMVar15->field_0x8 >> 0x16;
      if (pMVar15 != p_00->ppStore[uVar13]) {
        __assert_fail("pCube == p->ppStore[pCube->nLits]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covMinSop.c"
                      ,0x125,"void Min_SopRewrite(Min_Man_t *)");
      }
      p_00->ppStore[uVar13] = pMVar15->pNext;
      p_00->nCubes = iVar9 + -1;
      pMVar15->uData[local_68 >> 4] =
           pMVar15->uData[local_68 >> 4] ^ uVar7 << ((char)local_68 * '\x02' & 0x1fU);
      *(int *)&pMVar15->field_0x8 = *(int *)&pMVar15->field_0x8 + -0x400000;
      pMVar24->uData[local_64 >> 4] =
           pMVar24->uData[local_64 >> 4] ^ uVar12 << ((char)local_64 * '\x02' & 0x1fU);
      *(int *)&pMVar24->field_0x8 = *(int *)&pMVar24->field_0x8 + 0x400000;
    }
    else {
      if (uVar7 == 3 || uVar12 == 3) {
        __assert_fail("v01 != 3 && v10 != 3 && v11 != 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covMinSop.c"
                      ,0x139,"void Min_SopRewrite(Min_Man_t *)");
      }
      pMVar24->uData[iVar8] = pMVar24->uData[iVar8] ^ 3 << (cVar3 * '\x02' & 0x1fU);
      lVar18 = 0;
      do {
        for (pMVar16 = local_58->ppStore[lVar18]; pMVar16 != (Min_Cube_t *)0x0;
            pMVar16 = pMVar16->pNext) {
          if (pMVar16 != pMVar14) {
            uVar13 = *(uint *)&pMVar16->field_0x8 >> 10 & 0xfff;
            if (uVar13 == 0) {
LAB_0044bba7:
              pMVar24->uData[iVar8] = pMVar24->uData[iVar8] ^ 3 << (cVar3 * '\x02' & 0x1fU);
              goto LAB_0044bbbe;
            }
            uVar23 = 0;
            while ((pMVar24->uData[uVar23] & ~pMVar16->uData[uVar23]) == 0) {
              uVar23 = uVar23 + 1;
              if (uVar13 == uVar23) goto LAB_0044bba7;
            }
          }
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != (ulong)(*(uint *)&pMVar24->field_0x8 >> 0x16) + 1);
      pMVar24->uData[iVar8] = pMVar24->uData[iVar8] ^ 3 << (cVar3 * '\x02' & 0x1fU);
      pMVar15->uData[iVar8] = pMVar15->uData[iVar8] ^ uVar7 << (cVar3 * '\x02' & 0x1fU);
      *(int *)&pMVar15->field_0x8 = *(int *)&pMVar15->field_0x8 + 0x400000;
      pMVar24->uData[iVar9] = pMVar24->uData[iVar9] ^ (uVar26 ^ 3) << (cVar4 * '\x02' & 0x1fU);
      *(int *)&pMVar24->field_0x8 = *(int *)&pMVar24->field_0x8 + -0x400000;
    }
  }
  else {
    if (uVar13 != (uVar26 ^ 3)) {
      __assert_fail("v00 == (v10 ^ 3)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covMinSop.c"
                    ,0xb2,"void Min_SopRewrite(Min_Man_t *)");
    }
    if (uVar12 != (uVar27 ^ 3)) {
      __assert_fail("v01 == (v11 ^ 3)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covMinSop.c"
                    ,0xb3,"void Min_SopRewrite(Min_Man_t *)");
    }
    pMVar15->uData[lVar18] = 3 << sVar10 ^ uVar7;
    local_48 = local_58->ppStore;
    lVar17 = 0;
    do {
      for (pMVar16 = local_48[lVar17]; pMVar16 != (Min_Cube_t *)0x0; pMVar16 = pMVar16->pNext) {
        if (pMVar16 != pMVar14) {
          bVar6 = true;
          uVar21 = *(uint *)&pMVar16->field_0x8 >> 10 & 0xfff;
          if (uVar21 == 0) goto LAB_0044b78b;
          uVar23 = 0;
          while ((pMVar15->uData[uVar23] & ~pMVar16->uData[uVar23]) == 0) {
            uVar23 = uVar23 + 1;
            if (uVar21 == uVar23) goto LAB_0044b78b;
          }
        }
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 != (ulong)(*(uint *)&pMVar15->field_0x8 >> 0x16) + 1);
    bVar6 = false;
LAB_0044b78b:
    pMVar15->uData[lVar18] = uVar7;
    local_34 = pMVar15->uData[lVar22];
    pMVar15->uData[lVar22] = 3 << sVar11 ^ local_34;
    lVar17 = 0;
    do {
      for (pMVar16 = local_48[lVar17]; pMVar16 != (Min_Cube_t *)0x0; pMVar16 = pMVar16->pNext) {
        if (pMVar16 != pMVar14) {
          bVar5 = true;
          uVar7 = *(uint *)&pMVar16->field_0x8 >> 10 & 0xfff;
          if (uVar7 == 0) goto LAB_0044b813;
          uVar23 = 0;
          while ((pMVar15->uData[uVar23] & ~pMVar16->uData[uVar23]) == 0) {
            uVar23 = uVar23 + 1;
            if (uVar7 == uVar23) goto LAB_0044b813;
          }
        }
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 != (ulong)(*(uint *)&pMVar15->field_0x8 >> 0x16) + 1);
    bVar5 = false;
LAB_0044b813:
    pMVar15->uData[lVar22] = local_34;
    local_5c = uVar20;
    local_50 = lVar18;
    local_40 = lVar22;
    if ((bool)(bVar6 & bVar5)) {
      Extra_MmFixedEntryRecycle(local_58->pMemMan,(char *)pMVar25);
      pMVar15->uData[local_50] = pMVar15->uData[local_50] ^ (uVar13 ^ 3) << ((byte)local_5c & 0x1f);
      pMVar15->uData[lVar22] = pMVar15->uData[lVar22] ^ (uVar12 ^ 3) << ((byte)local_60 & 0x1f);
      *(int *)&pMVar15->field_0x8 = *(int *)&pMVar15->field_0x8 + -0x800000;
      pMVar24 = pMVar15;
      goto LAB_0044bc4d;
    }
    if (bVar6) {
      pMVar15->uData[lVar18] = pMVar15->uData[lVar18] ^ (uVar13 ^ 3) << sVar10;
      *(int *)&pMVar15->field_0x8 = *(int *)&pMVar15->field_0x8 + -0x400000;
      Min_SopAddCube(local_58,pMVar15);
      pMVar25->uData[local_40] = pMVar25->uData[local_40] ^ (uVar27 ^ 3) << ((byte)local_60 & 0x1f);
      *(int *)&pMVar25->field_0x8 = *(int *)&pMVar25->field_0x8 + -0x400000;
      goto LAB_0044bc4d;
    }
    if (bVar5) {
      pMVar15->uData[lVar22] = local_34 ^ (uVar12 ^ 3) << sVar11;
      *(int *)&pMVar15->field_0x8 = *(int *)&pMVar15->field_0x8 + -0x400000;
      Min_SopAddCube(local_58,pMVar15);
      pMVar25->uData[local_50] = pMVar25->uData[local_50] ^ (uVar26 ^ 3) << ((byte)local_5c & 0x1f);
      *(int *)&pMVar25->field_0x8 = *(int *)&pMVar25->field_0x8 + -0x400000;
      goto LAB_0044bc4d;
    }
  }
  Min_SopAddCube(p_00,pMVar15);
  pMVar24 = pMVar25;
LAB_0044bc4d:
  Min_SopAddCube(p_00,pMVar24);
  p = p_00;
  goto LAB_0044b47c;
LAB_0044b569:
  pMVar25 = (Min_Cube_t *)0x0;
  goto LAB_0044b56c;
}

Assistant:

void Min_SopMinimize( Min_Man_t * p )
{
    int nCubesInit, nCubesOld, nIter;
    if ( p->nCubes < 3 )
        return;
    nIter = 0;
    nCubesInit = p->nCubes;
    do {
        nCubesOld = p->nCubes;
        Min_SopRewrite( p );
        nIter++;
//    printf( "%d:%d->%d ", nIter, nCubesInit, p->nCubes );
    }
    while ( 100.0*(nCubesOld - p->nCubes)/nCubesOld > 3.0 );
//    printf( "\n" );

}